

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.cpp
# Opt level: O2

void __thiscall MD5::transform(MD5 *this,uint1 *block)

{
  uint4 uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint4 local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  
  uVar1 = this->state[0];
  uVar2 = this->state[1];
  uVar3 = this->state[2];
  uVar4 = this->state[3];
  decode(&local_78,block,0x40);
  uVar6 = local_78 + (uVar3 & uVar2) + uVar1 + (~uVar2 & uVar4) + 0xd76aa478;
  uVar7 = (uVar6 * 0x80 | uVar6 >> 0x19) + uVar2;
  uVar6 = (~uVar7 & uVar3) + (uVar7 & uVar2) + uVar4 + local_74 + 0xe8c7b756;
  uVar8 = (uVar6 * 0x1000 | uVar6 >> 0x14) + uVar7;
  uVar6 = (uVar8 & uVar7) + uVar3 + local_70 + (~uVar8 & uVar2) + 0x242070db;
  uVar6 = (uVar6 * 0x20000 | uVar6 >> 0xf) + uVar8;
  uVar5 = (uVar6 & uVar8) + local_6c + uVar2 + (~uVar6 & uVar7) + 0xc1bdceee;
  uVar5 = (uVar5 * 0x400000 | uVar5 >> 10) + uVar6;
  uVar7 = uVar7 + local_68 + (uVar5 & uVar6) + (~uVar5 & uVar8) + 0xf57c0faf;
  uVar7 = (uVar7 * 0x80 | uVar7 >> 0x19) + uVar5;
  uVar8 = uVar8 + local_64 + (uVar7 & uVar5) + (~uVar7 & uVar6) + 0x4787c62a;
  uVar8 = (uVar8 * 0x1000 | uVar8 >> 0x14) + uVar7;
  uVar6 = uVar6 + local_60 + (uVar8 & uVar7) + (~uVar8 & uVar5) + 0xa8304613;
  uVar6 = (uVar6 * 0x20000 | uVar6 >> 0xf) + uVar8;
  uVar5 = uVar5 + local_5c + (uVar6 & uVar8) + (~uVar6 & uVar7) + 0xfd469501;
  uVar5 = (uVar5 * 0x400000 | uVar5 >> 10) + uVar6;
  uVar7 = uVar7 + local_58 + (uVar5 & uVar6) + (~uVar5 & uVar8) + 0x698098d8;
  uVar7 = (uVar7 * 0x80 | uVar7 >> 0x19) + uVar5;
  uVar8 = uVar8 + local_54 + (uVar7 & uVar5) + (~uVar7 & uVar6) + 0x8b44f7af;
  uVar8 = (uVar8 * 0x1000 | uVar8 >> 0x14) + uVar7;
  uVar6 = (uVar6 + local_50 + (uVar8 & uVar7) + (~uVar8 & uVar5)) - 0xa44f;
  uVar6 = (uVar6 * 0x20000 | uVar6 >> 0xf) + uVar8;
  uVar5 = uVar5 + local_4c + (uVar6 & uVar8) + (~uVar6 & uVar7) + 0x895cd7be;
  uVar5 = (uVar5 * 0x400000 | uVar5 >> 10) + uVar6;
  uVar7 = uVar7 + local_48 + (uVar5 & uVar6) + (~uVar5 & uVar8) + 0x6b901122;
  uVar7 = (uVar7 * 0x80 | uVar7 >> 0x19) + uVar5;
  uVar8 = (~uVar7 & uVar6) + uVar8 + local_44 + (uVar7 & uVar5) + 0xfd987193;
  uVar9 = (uVar8 * 0x1000 | uVar8 >> 0x14) + uVar7;
  uVar6 = uVar6 + local_40 + (uVar9 & uVar7) + (uVar5 & ~uVar9) + 0xa679438e;
  uVar6 = (uVar6 * 0x20000 | uVar6 >> 0xf) + uVar9;
  uVar5 = (uVar7 & ~uVar6) + uVar5 + local_3c + (uVar6 & uVar9) + 0x49b40821;
  uVar8 = (uVar5 * 0x400000 | uVar5 >> 10) + uVar6;
  uVar5 = (uVar8 & uVar9) + (~uVar9 & uVar6) + local_74 + uVar7 + 0xf61e2562;
  uVar7 = (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar8;
  uVar5 = uVar9 + local_60 + (~uVar6 & uVar8) + (uVar7 & uVar6) + 0xc040b340;
  uVar9 = (uVar5 * 0x200 | uVar5 >> 0x17) + uVar7;
  uVar6 = (uVar9 & uVar8) + uVar6 + local_4c + (~uVar8 & uVar7) + 0x265e5a51;
  uVar5 = (uVar6 * 0x4000 | uVar6 >> 0x12) + uVar9;
  uVar6 = uVar8 + local_78 + (~uVar7 & uVar9) + (uVar5 & uVar7) + 0xe9b6c7aa;
  uVar8 = (uVar6 * 0x100000 | uVar6 >> 0xc) + uVar5;
  uVar6 = uVar7 + local_64 + (~uVar9 & uVar5) + (uVar8 & uVar9) + 0xd62f105d;
  uVar7 = (uVar6 * 0x20 | uVar6 >> 0x1b) + uVar8;
  uVar6 = (uVar7 & uVar5) + uVar9 + local_50 + (~uVar5 & uVar8) + 0x2441453;
  uVar6 = (uVar6 * 0x200 | uVar6 >> 0x17) + uVar7;
  uVar5 = uVar5 + local_3c + (~uVar8 & uVar7) + (uVar6 & uVar8) + 0xd8a1e681;
  uVar5 = (uVar5 * 0x4000 | uVar5 >> 0x12) + uVar6;
  uVar8 = uVar8 + local_68 + (~uVar7 & uVar6) + (uVar5 & uVar7) + 0xe7d3fbc8;
  uVar8 = (uVar8 * 0x100000 | uVar8 >> 0xc) + uVar5;
  uVar7 = uVar7 + local_54 + (~uVar6 & uVar5) + (uVar8 & uVar6) + 0x21e1cde6;
  uVar7 = (uVar7 * 0x20 | uVar7 >> 0x1b) + uVar8;
  uVar6 = uVar6 + local_40 + (~uVar5 & uVar8) + (uVar7 & uVar5) + 0xc33707d6;
  uVar6 = (uVar6 * 0x200 | uVar6 >> 0x17) + uVar7;
  uVar5 = uVar5 + local_6c + (~uVar8 & uVar7) + (uVar6 & uVar8) + 0xf4d50d87;
  uVar5 = (uVar5 * 0x4000 | uVar5 >> 0x12) + uVar6;
  uVar8 = uVar8 + local_58 + (~uVar7 & uVar6) + (uVar5 & uVar7) + 0x455a14ed;
  uVar8 = (uVar8 * 0x100000 | uVar8 >> 0xc) + uVar5;
  uVar7 = uVar7 + local_44 + (~uVar6 & uVar5) + (uVar8 & uVar6) + 0xa9e3e905;
  uVar7 = (uVar7 * 0x20 | uVar7 >> 0x1b) + uVar8;
  uVar6 = uVar6 + local_70 + (~uVar5 & uVar8) + (uVar7 & uVar5) + 0xfcefa3f8;
  uVar6 = (uVar6 * 0x200 | uVar6 >> 0x17) + uVar7;
  uVar5 = uVar5 + local_5c + (~uVar8 & uVar7) + (uVar6 & uVar8) + 0x676f02d9;
  uVar5 = (uVar5 * 0x4000 | uVar5 >> 0x12) + uVar6;
  uVar8 = (uVar5 & uVar7) + uVar8 + local_48 + (~uVar7 & uVar6) + 0x8d2a4c8a;
  uVar8 = (uVar8 * 0x100000 | uVar8 >> 0xc) + uVar5;
  uVar7 = ((uVar8 ^ uVar5 ^ uVar6) + local_64 + uVar7) - 0x5c6be;
  uVar9 = (uVar7 * 0x10 | uVar7 >> 0x1c) + uVar8;
  uVar6 = uVar6 + local_58 + (uVar8 ^ uVar5 ^ uVar9) + 0x8771f681;
  uVar6 = (uVar6 * 0x800 | uVar6 >> 0x15) + uVar9;
  uVar5 = uVar5 + local_4c + (uVar9 ^ uVar8 ^ uVar6) + 0x6d9d6122;
  uVar5 = (uVar5 * 0x10000 | uVar5 >> 0x10) + uVar6;
  uVar7 = uVar8 + local_40 + (uVar6 ^ uVar9 ^ uVar5) + 0xfde5380c;
  uVar7 = (uVar7 * 0x800000 | uVar7 >> 9) + uVar5;
  uVar8 = uVar9 + local_74 + (uVar5 ^ uVar6 ^ uVar7) + 0xa4beea44;
  uVar8 = (uVar8 * 0x10 | uVar8 >> 0x1c) + uVar7;
  uVar6 = uVar6 + local_68 + (uVar7 ^ uVar5 ^ uVar8) + 0x4bdecfa9;
  uVar6 = (uVar6 * 0x800 | uVar6 >> 0x15) + uVar8;
  uVar5 = uVar5 + local_5c + (uVar8 ^ uVar7 ^ uVar6) + 0xf6bb4b60;
  uVar5 = (uVar5 * 0x10000 | uVar5 >> 0x10) + uVar6;
  uVar7 = uVar7 + local_50 + (uVar6 ^ uVar8 ^ uVar5) + 0xbebfbc70;
  uVar7 = (uVar7 * 0x800000 | uVar7 >> 9) + uVar5;
  uVar8 = uVar8 + local_44 + (uVar5 ^ uVar6 ^ uVar7) + 0x289b7ec6;
  uVar8 = (uVar8 * 0x10 | uVar8 >> 0x1c) + uVar7;
  uVar6 = uVar6 + local_78 + (uVar7 ^ uVar5 ^ uVar8) + 0xeaa127fa;
  uVar6 = (uVar6 * 0x800 | uVar6 >> 0x15) + uVar8;
  uVar5 = (uVar8 ^ uVar7 ^ uVar6) + uVar5 + local_6c + 0xd4ef3085;
  uVar9 = (uVar5 * 0x10000 | uVar5 >> 0x10) + uVar6;
  uVar5 = (uVar6 ^ uVar8 ^ uVar9) + uVar7 + local_60 + 0x4881d05;
  uVar5 = (uVar5 * 0x800000 | uVar5 >> 9) + uVar9;
  uVar7 = uVar8 + local_54 + (uVar9 ^ uVar6 ^ uVar5) + 0xd9d4d039;
  uVar8 = (uVar7 * 0x10 | uVar7 >> 0x1c) + uVar5;
  uVar6 = (uVar5 ^ uVar9 ^ uVar8) + uVar6 + local_48 + 0xe6db99e5;
  uVar7 = (uVar6 * 0x800 | uVar6 >> 0x15) + uVar8;
  uVar6 = uVar9 + local_3c + (uVar8 ^ uVar5 ^ uVar7) + 0x1fa27cf8;
  uVar9 = (uVar6 * 0x10000 | uVar6 >> 0x10) + uVar7;
  uVar6 = (uVar7 ^ uVar8 ^ uVar9) + uVar5 + local_70 + 0xc4ac5665;
  uVar6 = (uVar6 * 0x800000 | uVar6 >> 9) + uVar9;
  uVar5 = ((~uVar7 | uVar6) ^ uVar9) + uVar8 + local_78 + 0xf4292244;
  uVar5 = (uVar5 * 0x40 | uVar5 >> 0x1a) + uVar6;
  uVar7 = uVar7 + local_5c + ((~uVar9 | uVar5) ^ uVar6) + 0x432aff97;
  uVar7 = (uVar7 * 0x400 | uVar7 >> 0x16) + uVar5;
  uVar8 = ((~uVar6 | uVar7) ^ uVar5) + uVar9 + local_40 + 0xab9423a7;
  uVar8 = (uVar8 * 0x8000 | uVar8 >> 0x11) + uVar7;
  uVar6 = uVar6 + local_64 + ((~uVar5 | uVar8) ^ uVar7) + 0xfc93a039;
  uVar6 = (uVar6 * 0x200000 | uVar6 >> 0xb) + uVar8;
  uVar5 = uVar5 + local_48 + ((~uVar7 | uVar6) ^ uVar8) + 0x655b59c3;
  uVar5 = (uVar5 * 0x40 | uVar5 >> 0x1a) + uVar6;
  uVar7 = uVar7 + local_6c + ((~uVar8 | uVar5) ^ uVar6) + 0x8f0ccc92;
  uVar7 = (uVar7 * 0x400 | uVar7 >> 0x16) + uVar5;
  uVar8 = (uVar8 + local_50 + ((~uVar6 | uVar7) ^ uVar5)) - 0x100b83;
  uVar8 = (uVar8 * 0x8000 | uVar8 >> 0x11) + uVar7;
  uVar6 = uVar6 + local_74 + ((~uVar5 | uVar8) ^ uVar7) + 0x85845dd1;
  uVar6 = (uVar6 * 0x200000 | uVar6 >> 0xb) + uVar8;
  uVar5 = uVar5 + local_58 + ((~uVar7 | uVar6) ^ uVar8) + 0x6fa87e4f;
  uVar5 = (uVar5 * 0x40 | uVar5 >> 0x1a) + uVar6;
  uVar7 = uVar7 + local_3c + ((~uVar8 | uVar5) ^ uVar6) + 0xfe2ce6e0;
  uVar7 = (uVar7 * 0x400 | uVar7 >> 0x16) + uVar5;
  uVar8 = uVar8 + local_60 + ((~uVar6 | uVar7) ^ uVar5) + 0xa3014314;
  uVar8 = (uVar8 * 0x8000 | uVar8 >> 0x11) + uVar7;
  uVar6 = uVar6 + local_44 + ((~uVar5 | uVar8) ^ uVar7) + 0x4e0811a1;
  uVar6 = (uVar6 * 0x200000 | uVar6 >> 0xb) + uVar8;
  uVar5 = uVar5 + local_68 + ((~uVar7 | uVar6) ^ uVar8) + 0xf7537e82;
  uVar5 = (uVar5 * 0x40 | uVar5 >> 0x1a) + uVar6;
  uVar7 = uVar7 + local_4c + ((~uVar8 | uVar5) ^ uVar6) + 0xbd3af235;
  uVar7 = (uVar7 * 0x400 | uVar7 >> 0x16) + uVar5;
  uVar8 = uVar8 + local_70 + ((~uVar6 | uVar7) ^ uVar5) + 0x2ad7d2bb;
  uVar8 = (uVar8 * 0x8000 | uVar8 >> 0x11) + uVar7;
  uVar6 = uVar6 + local_54 + ((~uVar5 | uVar8) ^ uVar7) + 0xeb86d391;
  this->state[0] = uVar5 + uVar1;
  this->state[1] = uVar2 + uVar8 + (uVar6 * 0x200000 | uVar6 >> 0xb);
  this->state[2] = uVar8 + uVar3;
  this->state[3] = uVar7 + uVar4;
  return;
}

Assistant:

void MD5::transform(const uint1 block[blocksize])
{
  uint4 a = state[0], b = state[1], c = state[2], d = state[3], x[16];
  decode (x, block, blocksize);
 
  /* Round 1 */
  FF (a, b, c, d, x[ 0], S11, 0xd76aa478); /* 1 */
  FF (d, a, b, c, x[ 1], S12, 0xe8c7b756); /* 2 */
  FF (c, d, a, b, x[ 2], S13, 0x242070db); /* 3 */
  FF (b, c, d, a, x[ 3], S14, 0xc1bdceee); /* 4 */
  FF (a, b, c, d, x[ 4], S11, 0xf57c0faf); /* 5 */
  FF (d, a, b, c, x[ 5], S12, 0x4787c62a); /* 6 */
  FF (c, d, a, b, x[ 6], S13, 0xa8304613); /* 7 */
  FF (b, c, d, a, x[ 7], S14, 0xfd469501); /* 8 */
  FF (a, b, c, d, x[ 8], S11, 0x698098d8); /* 9 */
  FF (d, a, b, c, x[ 9], S12, 0x8b44f7af); /* 10 */
  FF (c, d, a, b, x[10], S13, 0xffff5bb1); /* 11 */
  FF (b, c, d, a, x[11], S14, 0x895cd7be); /* 12 */
  FF (a, b, c, d, x[12], S11, 0x6b901122); /* 13 */
  FF (d, a, b, c, x[13], S12, 0xfd987193); /* 14 */
  FF (c, d, a, b, x[14], S13, 0xa679438e); /* 15 */
  FF (b, c, d, a, x[15], S14, 0x49b40821); /* 16 */
 
  /* Round 2 */
  GG (a, b, c, d, x[ 1], S21, 0xf61e2562); /* 17 */
  GG (d, a, b, c, x[ 6], S22, 0xc040b340); /* 18 */
  GG (c, d, a, b, x[11], S23, 0x265e5a51); /* 19 */
  GG (b, c, d, a, x[ 0], S24, 0xe9b6c7aa); /* 20 */
  GG (a, b, c, d, x[ 5], S21, 0xd62f105d); /* 21 */
  GG (d, a, b, c, x[10], S22,  0x2441453); /* 22 */
  GG (c, d, a, b, x[15], S23, 0xd8a1e681); /* 23 */
  GG (b, c, d, a, x[ 4], S24, 0xe7d3fbc8); /* 24 */
  GG (a, b, c, d, x[ 9], S21, 0x21e1cde6); /* 25 */
  GG (d, a, b, c, x[14], S22, 0xc33707d6); /* 26 */
  GG (c, d, a, b, x[ 3], S23, 0xf4d50d87); /* 27 */
  GG (b, c, d, a, x[ 8], S24, 0x455a14ed); /* 28 */
  GG (a, b, c, d, x[13], S21, 0xa9e3e905); /* 29 */
  GG (d, a, b, c, x[ 2], S22, 0xfcefa3f8); /* 30 */
  GG (c, d, a, b, x[ 7], S23, 0x676f02d9); /* 31 */
  GG (b, c, d, a, x[12], S24, 0x8d2a4c8a); /* 32 */
 
  /* Round 3 */
  HH (a, b, c, d, x[ 5], S31, 0xfffa3942); /* 33 */
  HH (d, a, b, c, x[ 8], S32, 0x8771f681); /* 34 */
  HH (c, d, a, b, x[11], S33, 0x6d9d6122); /* 35 */
  HH (b, c, d, a, x[14], S34, 0xfde5380c); /* 36 */
  HH (a, b, c, d, x[ 1], S31, 0xa4beea44); /* 37 */
  HH (d, a, b, c, x[ 4], S32, 0x4bdecfa9); /* 38 */
  HH (c, d, a, b, x[ 7], S33, 0xf6bb4b60); /* 39 */
  HH (b, c, d, a, x[10], S34, 0xbebfbc70); /* 40 */
  HH (a, b, c, d, x[13], S31, 0x289b7ec6); /* 41 */
  HH (d, a, b, c, x[ 0], S32, 0xeaa127fa); /* 42 */
  HH (c, d, a, b, x[ 3], S33, 0xd4ef3085); /* 43 */
  HH (b, c, d, a, x[ 6], S34,  0x4881d05); /* 44 */
  HH (a, b, c, d, x[ 9], S31, 0xd9d4d039); /* 45 */
  HH (d, a, b, c, x[12], S32, 0xe6db99e5); /* 46 */
  HH (c, d, a, b, x[15], S33, 0x1fa27cf8); /* 47 */
  HH (b, c, d, a, x[ 2], S34, 0xc4ac5665); /* 48 */
 
  /* Round 4 */
  II (a, b, c, d, x[ 0], S41, 0xf4292244); /* 49 */
  II (d, a, b, c, x[ 7], S42, 0x432aff97); /* 50 */
  II (c, d, a, b, x[14], S43, 0xab9423a7); /* 51 */
  II (b, c, d, a, x[ 5], S44, 0xfc93a039); /* 52 */
  II (a, b, c, d, x[12], S41, 0x655b59c3); /* 53 */
  II (d, a, b, c, x[ 3], S42, 0x8f0ccc92); /* 54 */
  II (c, d, a, b, x[10], S43, 0xffeff47d); /* 55 */
  II (b, c, d, a, x[ 1], S44, 0x85845dd1); /* 56 */
  II (a, b, c, d, x[ 8], S41, 0x6fa87e4f); /* 57 */
  II (d, a, b, c, x[15], S42, 0xfe2ce6e0); /* 58 */
  II (c, d, a, b, x[ 6], S43, 0xa3014314); /* 59 */
  II (b, c, d, a, x[13], S44, 0x4e0811a1); /* 60 */
  II (a, b, c, d, x[ 4], S41, 0xf7537e82); /* 61 */
  II (d, a, b, c, x[11], S42, 0xbd3af235); /* 62 */
  II (c, d, a, b, x[ 2], S43, 0x2ad7d2bb); /* 63 */
  II (b, c, d, a, x[ 9], S44, 0xeb86d391); /* 64 */
 
  state[0] += a;
  state[1] += b;
  state[2] += c;
  state[3] += d;
 
  // Zeroize sensitive information.
  memset(x, 0, sizeof x);
}